

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

string * __thiscall
testing::internal::
DefaultParamName<std::tuple<void(*)(macroblockd*,AV1Common_const*,int,int,mv_const*,unsigned_char*,int,int,int,int,unsigned_char_const*,int,int),BLOCK_SIZE>>
          (string *__return_storage_ptr__,internal *this,
          TestParamInfo<std::tuple<void_(*)(macroblockd_*,_const_AV1Common_*,_int,_int,_const_mv_*,_unsigned_char_*,_int,_int,_int,_int,_const_unsigned_char_*,_int,_int),_BLOCK_SIZE>_>
          *info)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  Message::Message((Message *)&local_20);
  Message::operator<<((Message *)&local_20,(unsigned_long *)(this + 0x10));
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&local_20);
  if (local_20._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultParamName(const TestParamInfo<ParamType>& info) {
  Message name_stream;
  name_stream << info.index;
  return name_stream.GetString();
}